

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_b44ed7::HandleFilterCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  string *psVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  string_view separator;
  string_view value_00;
  long local_1a8;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  RegularExpression regex;
  string error;
  undefined1 local_60 [8];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar7 = lVar8 >> 5;
  if (uVar7 < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regex,"sub-command FILTER requires a list to be specified.",
               (allocator<char> *)&value);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002b6f70:
    std::__cxx11::string::~string((string *)&regex);
    return false;
  }
  if (lVar8 == 0x40) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regex,"sub-command FILTER requires an operator to be specified.",
               (allocator<char> *)&value);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002b6f70;
  }
  if (uVar7 < 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regex,"sub-command FILTER requires a mode to be specified.",
               (allocator<char> *)&value);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002b6f70;
  }
  pbVar11 = pbVar1 + 2;
  bVar4 = std::operator==(pbVar11,"INCLUDE");
  if ((!bVar4) && (bVar5 = std::operator==(pbVar11,"EXCLUDE"), !bVar5)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regex,
                   "sub-command FILTER does not recognize operator ",pbVar11);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002b6f70;
  }
  psVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  varArgsExpanded.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = GetList(&varArgsExpanded,psVar9,status->Makefile);
  bVar5 = true;
  if (!bVar6) goto LAB_002b7148;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 3;
  bVar5 = std::operator==(pbVar11,"REGEX");
  if (bVar5) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0xa0) {
      cmsys::RegularExpression::RegularExpression(&regex,pbVar1 + 4);
      pbVar3 = varArgsExpanded.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = varArgsExpanded.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = regex.program != (char *)0x0;
      if (regex.program == (char *)0x0) {
        value._M_dataplus._M_p = (pointer)0x38;
        value._M_string_length = (size_type)anon_var_dwarf_b42870;
        local_58._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pbVar1[4]._M_dataplus._M_p;
        local_60 = (undefined1  [8])pbVar1[4]._M_string_length;
        cmStrCat<char[3]>(&error,(cmAlphaNum *)&value,(cmAlphaNum *)local_60,(char (*) [3])0x5b59a8)
        ;
        std::__cxx11::string::_M_assign((string *)&status->Error);
        psVar9 = &error;
      }
      else {
        local_58._M_current._0_1_ = bVar4;
        value._M_string_length = CONCAT71(value._M_string_length._1_7_,bVar4);
        local_1a8 = (long)varArgsExpanded.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)varArgsExpanded.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        __it._M_current =
             varArgsExpanded.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        value._M_dataplus._M_p = (pointer)&regex;
        local_60 = (undefined1  [8])&regex;
        for (lVar8 = local_1a8 >> 7; _Var10._M_current = __it._M_current, 0 < lVar8;
            lVar8 = lVar8 + -1) {
          bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                            ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,__it);
          if (bVar4) goto LAB_002b70b7;
          bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                            ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,
                             __it._M_current + 1);
          _Var10._M_current = __it._M_current + 1;
          if (bVar4) goto LAB_002b70b7;
          bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                            ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,
                             __it._M_current + 2);
          _Var10._M_current = __it._M_current + 2;
          if (bVar4) goto LAB_002b70b7;
          bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                            ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,
                             __it._M_current + 3);
          _Var10._M_current = __it._M_current + 3;
          if (bVar4) goto LAB_002b70b7;
          __it._M_current = __it._M_current + 4;
          local_1a8 = local_1a8 + -0x80;
        }
        local_1a8 = local_1a8 >> 5;
        if (local_1a8 == 1) {
LAB_002b70a1:
          bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                            ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,__it);
          _Var10._M_current = __it._M_current;
          if (!bVar4) {
            _Var10._M_current = pbVar3;
          }
LAB_002b70b7:
          pbVar11 = _Var10._M_current;
          if (_Var10._M_current != pbVar3) {
            while (_Var10._M_current = _Var10._M_current + 1, _Var10._M_current != pbVar3) {
              bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                                ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_60,_Var10)
              ;
              if (!bVar4) {
                std::__cxx11::string::operator=((string *)pbVar11,(string *)_Var10._M_current);
                pbVar11 = pbVar11 + 1;
              }
            }
          }
        }
        else {
          if (local_1a8 == 2) {
LAB_002b708c:
            bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                              ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,__it);
            _Var10._M_current = __it._M_current;
            if (!bVar4) {
              __it._M_current = __it._M_current + 1;
              goto LAB_002b70a1;
            }
            goto LAB_002b70b7;
          }
          pbVar11 = pbVar3;
          if (local_1a8 == 3) {
            bVar4 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                              ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)&value,__it);
            if (!bVar4) {
              __it._M_current = __it._M_current + 1;
              goto LAB_002b708c;
            }
            goto LAB_002b70b7;
          }
        }
        local_60 = (undefined1  [8])pbVar2;
        separator._M_str = ";";
        separator._M_len = 1;
        local_58._M_current = pbVar11;
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  (&value,(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_60,separator);
        value_00._M_str = value._M_dataplus._M_p;
        value_00._M_len = value._M_string_length;
        cmMakefile::AddDefinition(status->Makefile,psVar9,value_00);
        psVar9 = &value;
      }
      std::__cxx11::string::~string((string *)psVar9);
      cmsys::RegularExpression::~RegularExpression(&regex);
      goto LAB_002b7148;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regex,"sub-command FILTER, mode REGEX requires five arguments.",
               (allocator<char> *)&value);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&regex,
                   "sub-command FILTER does not recognize mode ",pbVar11);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&regex);
  bVar5 = false;
LAB_002b7148:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&varArgsExpanded);
  return bVar5;
}

Assistant:

bool HandleFilterCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command FILTER requires a list to be specified.");
    return false;
  }

  if (args.size() < 3) {
    status.SetError(
      "sub-command FILTER requires an operator to be specified.");
    return false;
  }

  if (args.size() < 4) {
    status.SetError("sub-command FILTER requires a mode to be specified.");
    return false;
  }

  const std::string& op = args[2];
  bool includeMatches;
  if (op == "INCLUDE") {
    includeMatches = true;
  } else if (op == "EXCLUDE") {
    includeMatches = false;
  } else {
    status.SetError("sub-command FILTER does not recognize operator " + op);
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile())) {
    return true;
  }

  const std::string& mode = args[3];
  if (mode == "REGEX") {
    if (args.size() != 5) {
      status.SetError("sub-command FILTER, mode REGEX "
                      "requires five arguments.");
      return false;
    }
    return FilterRegex(args, includeMatches, listName, varArgsExpanded,
                       status);
  }

  status.SetError("sub-command FILTER does not recognize mode " + mode);
  return false;
}